

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

bool __thiscall glu::VarType::operator==(VarType *this,VarType *other)

{
  Type TVar1;
  bool bVar2;
  bool local_2e;
  bool local_2d;
  VarType *other_local;
  VarType *this_local;
  
  if (this->m_type == other->m_type) {
    TVar1 = this->m_type;
    if (TVar1 == TYPE_BASIC) {
      local_2d = false;
      if ((this->m_data).basic.type == (other->m_data).basic.type) {
        local_2d = (this->m_data).basic.precision == (other->m_data).basic.precision;
      }
      this_local._7_1_ = local_2d;
    }
    else if (TVar1 == TYPE_ARRAY) {
      bVar2 = operator==((this->m_data).array.elementType,(other->m_data).array.elementType);
      local_2e = false;
      if (bVar2) {
        local_2e = (this->m_data).array.size == (other->m_data).array.size;
      }
      this_local._7_1_ = local_2e;
    }
    else if (TVar1 == TYPE_STRUCT) {
      this_local._7_1_ = (this->m_data).array.elementType == (other->m_data).array.elementType;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool VarType::operator== (const VarType& other) const
{
	if (m_type != other.m_type)
		return false;

	switch (m_type)
	{
		case TYPE_BASIC:
			return	m_data.basic.type == other.m_data.basic.type &&
					m_data.basic.precision == other.m_data.basic.precision;

		case TYPE_ARRAY:
			return	*m_data.array.elementType == *other.m_data.array.elementType &&
					m_data.array.size == other.m_data.array.size;

		case TYPE_STRUCT:
			return m_data.structPtr == other.m_data.structPtr;

		default:
			DE_ASSERT(false);
			return 0;
	}
}